

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::Context::Context
          (Context *this,FileDescriptor *file,Options *options)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false> this_00;
  long lVar6;
  long lVar7;
  
  this_00._M_head_impl = (ClassNameResolver *)operator_new(0x30);
  ClassNameResolver::ClassNameResolver(this_00._M_head_impl);
  (this->name_resolver_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
  .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>._M_head_impl
       = this_00._M_head_impl;
  p_Var1 = &(this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->field_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->oneof_generator_info_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar3 = options->generate_mutable_code;
  bVar4 = options->generate_shared_code;
  bVar5 = options->enforce_lite;
  (this->options_).generate_immutable_code = options->generate_immutable_code;
  (this->options_).generate_mutable_code = bVar3;
  (this->options_).generate_shared_code = bVar4;
  (this->options_).enforce_lite = bVar5;
  (this->options_).annotate_code = options->annotate_code;
  (this->options_).annotation_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).annotation_list_file.field_2;
  pcVar2 = (options->annotation_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).annotation_list_file,pcVar2,
             pcVar2 + (options->annotation_list_file)._M_string_length);
  (this->options_).output_list_file._M_dataplus._M_p =
       (pointer)&(this->options_).output_list_file.field_2;
  pcVar2 = (options->output_list_file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->options_).output_list_file,pcVar2,
             pcVar2 + (options->output_list_file)._M_string_length);
  if (0 < *(int *)(file + 0x2c)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      InitializeFieldGeneratorInfoForMessage(this,(Descriptor *)(*(long *)(file + 0x58) + lVar6));
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x88;
    } while (lVar7 < *(int *)(file + 0x2c));
  }
  return;
}

Assistant:

Context::Context(const FileDescriptor* file, const Options& options)
    : name_resolver_(new ClassNameResolver), options_(options) {
  InitializeFieldGeneratorInfo(file);
}